

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

bool32 rw::ps2::rasterFromImage(Raster *raster,Image *image)

{
  int iVar1;
  FILE *__stream;
  uint8 *puVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uVar5;
  int32 y;
  int iVar6;
  int32 psm;
  long lVar7;
  long lVar8;
  uint8 *puVar9;
  int32 x;
  int iVar10;
  int minw;
  uint32 uStack_4c;
  Raster *local_48;
  uint8 *local_40;
  int minh;
  
  iVar6 = image->depth;
  uVar4 = iVar6 << 0x1e | iVar6 - 4U >> 2;
  if (uVar4 < 8) {
    lVar8 = (long)nativeRasterOffset;
    switch(uVar4) {
    case 0:
      if (raster->format == 0x4500) {
        iVar10 = 0x10;
        goto LAB_00125bee;
      }
      break;
    case 1:
      iVar10 = 0x100;
      if (raster->format == 0x2500) goto LAB_00125bee;
      break;
    case 3:
      if (raster->format == 0x100) {
LAB_00125bec:
        iVar10 = 0;
LAB_00125bee:
        if (iVar6 < 9) {
          puVar9 = image->palette;
          puVar2 = Raster::lockPalette(raster,5);
          memcpy(puVar2,puVar9,(ulong)(uint)(iVar10 * 4));
          for (lVar7 = 0; iVar10 != (int)lVar7; lVar7 = lVar7 + 1) {
            puVar2[lVar7 * 4 + 3] = (uint8)((ushort)((ushort)puVar2[lVar7 * 4 + 3] << 7) / 0xff);
          }
          Raster::unlockPalette(raster);
          psm = (image->depth == 4) + 0x13;
        }
        else {
          psm = 0x13;
        }
        transferMinSize(psm,(int)*(char *)((long)&raster->pixels + lVar8 + 4),&minw,&minh);
        if (minw < image->width) {
          minw = image->width;
        }
        puVar9 = image->pixels;
        local_48 = raster;
        puVar2 = Raster::lock(raster,0,5);
        if (image->depth == 4) {
          compressPal4(puVar2,minw / 2,puVar9,image->stride,image->width,image->height);
        }
        else if (image->depth == 8) {
          copyPal8(puVar2,minw,puVar9,image->stride,image->width,image->height);
        }
        else {
          for (iVar6 = 0; iVar6 < image->height; iVar6 = iVar6 + 1) {
            local_40 = puVar9;
            for (iVar10 = 0; iVar10 < image->width; iVar10 = iVar10 + 1) {
              iVar1 = image->depth;
              if (iVar1 == 0x20) {
                *puVar2 = *puVar9;
                puVar2[1] = puVar9[1];
                puVar2[2] = puVar9[2];
                puVar2[3] = (uint8)((ushort)((ushort)puVar9[3] << 7) / 0xff);
LAB_00125d8d:
                puVar2 = puVar2 + 4;
              }
              else {
                if (iVar1 == 0x18) {
                  *puVar2 = *puVar9;
                  puVar2[1] = puVar9[1];
                  puVar2[2] = puVar9[2];
                  puVar2[3] = 0x80;
                  goto LAB_00125d8d;
                }
                if (iVar1 == 0x10) {
                  conv_ABGR1555_from_ARGB1555(puVar2,puVar9);
                  puVar2 = puVar2 + 2;
                }
              }
              puVar9 = puVar9 + image->bpp;
            }
            puVar9 = local_40 + image->stride;
          }
        }
        Raster::unlock(local_48,0);
        return 1;
      }
      break;
    case 5:
    case 7:
      uVar4 = raster->format;
      if ((uVar4 == 0x500) || (uVar4 == 0x600)) {
        if ((uVar4 & 0xf00) == 0x600) {
          uVar5 = 0x66f;
          goto LAB_00125de4;
        }
        goto LAB_00125bec;
      }
    }
  }
  uVar5 = 0x669;
LAB_00125de4:
  minw = 0xb00;
  uStack_4c = 0x8000000a;
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
          uVar5);
  __stream = _stderr;
  pcVar3 = dbgsprint(0x8000000a);
  fprintf(__stream,"%s\n",pcVar3);
  setError((Error *)&minw);
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 pallength = 0;
	switch(image->depth){
	case 24:
	case 32:
		if(raster->format != Raster::C8888 &&
		   raster->format != Raster::C888)	// unsafe already
			goto err;
		break;
	case 16:
		if(raster->format != Raster::C1555) goto err;
		break;
	case 8:
		if(raster->format != (Raster::PAL8 | Raster::C8888)) goto err;
		pallength = 256;
		break;
	case 4:
		if(raster->format != (Raster::PAL4 | Raster::C8888)) goto err;
		pallength = 16;
		break;
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	// unsafe
	if((raster->format&0xF00) == Raster::C888){
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	if(image->depth <= 8){
		in = image->palette;
		out = raster->lockPalette(Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		memcpy(out, in, 4*pallength);
		for(int32 i = 0; i < pallength; i++){
			out[3] = out[3]*128/255;
			out += 4;
		}
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(image->depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(image->width, minw);
	uint8 *src = image->pixels;
	out = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	if(image->depth == 4){
		compressPal4(out, tw/2, src, image->stride, image->width, image->height);
	}else if(image->depth == 8){
		copyPal8(out, tw, src, image->stride, image->width, image->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			in = src;
			for(int32 x = 0; x < image->width; x++){
				switch(image->depth){
				case 16:
					conv_ARGB1555_from_ABGR1555(out, in);
					out += 2;
					break;
				case 24:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = 0x80;
					out += 4;
					break;
				case 32:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*128/255;
					out += 4;
					break;
				}
				in += image->bpp;
			}
			src += image->stride;
		}
	}
	raster->unlock(0);
	return 1;
}